

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest9::FunctionalTest9(FunctionalTest9 *this,Context *context)

{
  Context *context_local;
  FunctionalTest9 *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,
             "subroutines_3_subroutine_types_and_subroutine_uniforms_one_function",
             "Makes sure that program with one function associated with 3 different subroutine types and 3 subroutine uniforms using that function compiles and works as expected"
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FunctionalTest9_03233a68;
  this->m_has_test_passed = true;
  this->m_n_points_to_draw = 0x10;
  this->m_po_id = 0;
  this->m_vao_id = 0;
  this->m_vs_id = 0;
  this->m_xfb_bo_id = 0;
  return;
}

Assistant:

FunctionalTest9::FunctionalTest9(deqp::Context& context)
	: TestCase(context, "subroutines_3_subroutine_types_and_subroutine_uniforms_one_function",
			   "Makes sure that program with one function associated with 3 different "
			   "subroutine types and 3 subroutine uniforms using that function compiles "
			   "and works as expected")
	, m_has_test_passed(true)
	, m_n_points_to_draw(16) /* arbitrary value */
	, m_po_id(0)
	, m_vao_id(0)
	, m_vs_id(0)
	, m_xfb_bo_id(0)
{
	/* Left blank intentionally */
}